

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

SampledSpectrum __thiscall
pbrt::PortalImageInfiniteLight::Le
          (PortalImageInfiniteLight *this,Ray *ray,SampledWavelengths *lambda)

{
  ulong uVar1;
  undefined1 in_ZMM0 [64];
  undefined1 auVar5 [56];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar6 [64];
  Vector3<float> VVar8;
  Bounds2f BVar9;
  Point2f st;
  Tuple2<pbrt::Point2,_float> local_50;
  undefined1 local_48 [16];
  Tuple3<pbrt::Vector3,_float> local_38;
  SampledSpectrum local_28;
  undefined1 extraout_var [56];
  undefined1 auVar7 [56];
  
  auVar7 = in_ZMM1._8_56_;
  auVar5 = in_ZMM0._8_56_;
  VVar8 = Normalize<float>(&ray->d);
  local_38.z = VVar8.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar2._0_8_ = VVar8.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar2._8_56_ = auVar5;
  local_38._0_8_ = vmovlps_avx(auVar2._0_16_);
  auVar3._0_8_ = ImageFromRender(this,(Vector3f *)&local_38,(Float *)0x0);
  auVar3._8_56_ = extraout_var;
  local_48 = auVar3._0_16_;
  local_50 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(local_48);
  auVar5 = extraout_var;
  BVar9 = ImageBounds(this,&ray->o);
  auVar6._0_8_ = BVar9.pMax.super_Tuple2<pbrt::Point2,_float>;
  auVar6._8_56_ = auVar7;
  auVar4._0_8_ = BVar9.pMin.super_Tuple2<pbrt::Point2,_float>;
  auVar4._8_56_ = auVar5;
  if ((((local_48._0_4_ < BVar9.pMin.super_Tuple2<pbrt::Point2,_float>.x) ||
       (BVar9.pMax.super_Tuple2<pbrt::Point2,_float>.x < local_48._0_4_)) ||
      (uVar1 = vcmpps_avx512vl(auVar4._0_16_,local_48,2), (uVar1 & 2) == 0)) ||
     (uVar1 = vcmpps_avx512vl(local_48,auVar6._0_16_,2), (uVar1 >> 1 & 1) == 0)) {
    SampledSpectrum::SampledSpectrum(&local_28,0.0);
  }
  else {
    local_28 = ImageLookup(this,(Point2f *)&local_50,lambda);
  }
  return (array<float,_4>)(array<float,_4>)local_28;
}

Assistant:

SampledSpectrum PortalImageInfiniteLight::Le(const Ray &ray,
                                             const SampledWavelengths &lambda) const {
    // Ignore world to light...
    Vector3f w = Normalize(ray.d);
    Point2f st = ImageFromRender(w);

    if (!Inside(st, ImageBounds(ray.o)))
        return SampledSpectrum(0.f);

    return ImageLookup(st, lambda);
}